

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O1

ssize_t Curl_bufq_pass(bufq *q,Curl_bufq_writer *writer,void *writer_ctx,CURLcode *err)

{
  bool bVar1;
  _Bool _Var2;
  size_t amount;
  long lVar3;
  size_t blen;
  uchar *buf;
  size_t local_40;
  uchar *local_38;
  
  lVar3 = 0;
  do {
    _Var2 = Curl_bufq_peek(q,&local_38,&local_40);
    if (!_Var2) {
      return lVar3;
    }
    amount = (*writer)(writer_ctx,local_38,local_40,err);
    if ((long)amount < 0) {
      if ((lVar3 == 0) || (*err != CURLE_AGAIN)) {
LAB_0064c025:
        lVar3 = -1;
      }
LAB_0064c02c:
      bVar1 = false;
    }
    else {
      if (amount == 0) {
        if (lVar3 == 0) {
          *err = CURLE_AGAIN;
          goto LAB_0064c025;
        }
        goto LAB_0064c02c;
      }
      Curl_bufq_skip(q,amount);
      lVar3 = lVar3 + amount;
      bVar1 = true;
    }
    if (!bVar1) {
      return lVar3;
    }
  } while( true );
}

Assistant:

ssize_t Curl_bufq_pass(struct bufq *q, Curl_bufq_writer *writer,
                       void *writer_ctx, CURLcode *err)
{
  const unsigned char *buf;
  size_t blen;
  ssize_t nwritten = 0;

  while(Curl_bufq_peek(q, &buf, &blen)) {
    ssize_t chunk_written;

    chunk_written = writer(writer_ctx, buf, blen, err);
    if(chunk_written < 0) {
      if(!nwritten || *err != CURLE_AGAIN) {
        /* blocked on first write or real error, fail */
        nwritten = -1;
      }
      break;
    }
    if(!chunk_written) {
      if(!nwritten) {
        /* treat as blocked */
        *err = CURLE_AGAIN;
        nwritten = -1;
      }
      break;
    }
    Curl_bufq_skip(q, (size_t)chunk_written);
    nwritten += chunk_written;
  }
  return nwritten;
}